

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O3

void Psr_ManWriteVerilog(char *pFileName,Vec_Ptr_t *vPrs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Psr_Ntk_t *p;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  uint uVar7;
  FILE *__stream;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  undefined1 auVar16 [16];
  Vec_Int_t *local_78;
  long lStack_70;
  Vec_Int_t *local_68;
  long lStack_60;
  Vec_Int_t *local_58;
  long lStack_50;
  Vec_Int_t *local_48;
  long lStack_40;
  
  if (vPrs->nSize < 1) {
    piVar14 = (int *)0x0;
  }
  else {
    piVar14 = (int *)*vPrs->pArray;
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  pcVar8 = Abc_NamStr(*(Abc_Nam_t **)(piVar14 + 2),*piVar14);
  Extra_TimeStamp();
  fprintf(__stream,"// Design \"%s\" written by ABC on %s\n\n",pcVar8);
  if (0 < vPrs->nSize) {
    lVar10 = 0;
    do {
      p = (Psr_Ntk_t *)vPrs->pArray[lVar10];
      pcVar8 = Abc_NamStr(p->pStrs,p->iModuleName);
      fprintf(__stream,"module %s (\n    ",pcVar8);
      if (0 < (p->vOrder).nSize) {
        uVar11 = 0;
        do {
          pcVar9 = Abc_NamStr(p->pStrs,(p->vOrder).pArray[uVar11]);
          pcVar8 = "    \"%s\", ";
          if (uVar11 == (p->vOrder).nSize - 1) {
            pcVar8 = "T = %d\t\t";
          }
          fprintf(__stream,"%s%s",pcVar9,pcVar8 + 8);
          uVar11 = uVar11 + 1;
        } while ((long)uVar11 < (long)(p->vOrder).nSize);
      }
      fwrite("\n  );\n",6,1,__stream);
      auVar16._8_4_ = (int)p;
      auVar16._0_8_ = p;
      auVar16._12_4_ = (int)((ulong)p >> 0x20);
      lVar13 = auVar16._8_8_;
      lVar12 = 0;
      do {
        local_58 = &p->vInouts;
        lStack_50 = lVar13 + 0x30;
        local_48 = &p->vOutputs;
        lStack_40 = lVar13 + 0x50;
        local_68 = &p->vOutputsR;
        lStack_60 = lVar13 + 0x90;
        local_78 = &p->vInoutsR;
        lStack_70 = lVar13 + 0x70;
        if (lVar12 == 3) {
          fputc(10,__stream);
        }
        pVVar4 = (&local_58)[lVar12];
        if (0 < pVVar4->nSize) {
          pVVar5 = (&local_78)[lVar12];
          lVar15 = 0;
          do {
            pcVar8 = "";
            if (pVVar5->nSize <= lVar15) goto LAB_0039e6ea;
            iVar1 = pVVar4->pArray[lVar15];
            iVar2 = pVVar5->pArray[lVar15];
            iVar3 = *(int *)(&DAT_0097af90 + lVar12 * 4);
            if (iVar2 != 0) {
              pcVar8 = Abc_NamStr(p->pStrs,iVar2);
            }
            pcVar9 = Abc_NamStr(p->pStrs,iVar1);
            fprintf(__stream,"  %s %s%s;\n",&DAT_0097af90 + iVar3,pcVar8,pcVar9);
            lVar15 = lVar15 + 1;
          } while (lVar15 < pVVar4->nSize);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 4);
      fputc(10,__stream);
      if (0 < (p->vObjs).nSize) {
        lVar12 = 0;
        do {
          piVar14 = (p->vObjs).pArray;
          iVar1 = piVar14[lVar12];
          if (((long)iVar1 < 0) || (uVar7 = (p->vBoxes).nSize, (int)uVar7 <= iVar1)) {
LAB_0039e6ea:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar6 = (p->vBoxes).pArray;
          Psr_BoxSignals_V._0_4_ = piVar6[iVar1] + -2;
          iVar1 = piVar14[lVar12];
          Psr_BoxSignals_V._4_4_ = Psr_BoxSignals_V._0_4_;
          if ((iVar1 < -3) || (uVar7 <= iVar1 + 3U)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          Psr_BoxSignals_V._8_8_ = piVar6 + (iVar1 + 3U);
          if ((((p->vObjs).nSize <= lVar12) || (iVar1 < -1)) || (uVar7 <= iVar1 + 1U))
          goto LAB_0039e6ea;
          iVar1 = piVar6[iVar1 + 1U];
          if (iVar1 == 0x14) {
            if (Psr_BoxSignals_V._0_4_ != 8) {
              __assert_fail("Vec_IntSize(vSigs) == 8",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x60,"void Psr_ManWriteVerilogMux(FILE *, Psr_Ntk_t *, Vec_Int_t *)");
            }
            fwrite("  assign ",9,1,__stream);
            if ((long)(int)Psr_BoxSignals_V._4_4_ < 1) {
LAB_0039e728:
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x201,"int Vec_IntEntryLast(Vec_Int_t *)");
            }
            Psr_ManWriteVerilogSignal
                      ((FILE *)__stream,p,
                       *(int *)(Psr_BoxSignals_V._8_8_ + -4 + (long)(int)Psr_BoxSignals_V._4_4_ * 4)
                      );
            fputs(" = ",__stream);
            if (1 < (int)Psr_BoxSignals_V._4_4_) {
              lVar13 = 0;
              do {
                Psr_ManWriteVerilogSignal
                          ((FILE *)__stream,p,*(int *)(Psr_BoxSignals_V._8_8_ + 4 + lVar13 * 4));
                fputs(&DAT_0097afa0 + *(int *)((long)&DAT_0097afa4 + lVar13 * 2),__stream);
                if (lVar13 == 4) break;
                lVar15 = lVar13 + 3;
                lVar13 = lVar13 + 2;
              } while (lVar15 < (int)Psr_BoxSignals_V._4_4_);
            }
          }
          else {
            if (*(int *)Psr_BoxSignals_V._8_8_ == 0) {
              uVar7 = iVar1 - 6;
              if ((0xf < uVar7) || ((0xbfffU >> (uVar7 & 0x1f) & 1) == 0)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                              ,0x3ab,"char *Ptr_TypeToName(Bac_ObjType_t)");
              }
              fprintf(__stream,"  %s (",&DAT_0097afb0 + *(int *)(&DAT_0097afb0 + (ulong)uVar7 * 4));
              if ((long)(int)Psr_BoxSignals_V._4_4_ < 1) goto LAB_0039e728;
              Psr_ManWriteVerilogSignal
                        ((FILE *)__stream,p,
                         *(int *)(Psr_BoxSignals_V._8_8_ + -4 +
                                 (long)(int)Psr_BoxSignals_V._4_4_ * 4));
              if ((p->vObjs).nSize <= lVar12) goto LAB_0039e6ea;
              iVar1 = (p->vObjs).pArray[lVar12];
              if (((long)iVar1 < 0) || ((p->vBoxes).nSize <= iVar1)) goto LAB_0039e6ea;
              if (5 < (p->vBoxes).pArray[iVar1]) {
                fwrite(", ",2,1,__stream);
              }
              Psr_ManWriteVerilogArray
                        ((FILE *)__stream,p,(Vec_Int_t *)Psr_BoxSignals_V,0,
                         Psr_BoxSignals_V._4_4_ + -2,1);
            }
            else {
              pcVar8 = Abc_NamStr(p->pStrs,iVar1);
              if ((((p->vObjs).nSize <= lVar12) || (iVar1 = (p->vObjs).pArray[lVar12], iVar1 < -2))
                 || (uVar7 = iVar1 + 2, (p->vBoxes).nSize <= (int)uVar7)) goto LAB_0039e6ea;
              iVar1 = (p->vBoxes).pArray[uVar7];
              pcVar9 = "";
              if (iVar1 != 0) {
                pcVar9 = Abc_NamStr(p->pStrs,iVar1);
              }
              fprintf(__stream,"  %s %s (",pcVar8,pcVar9);
              if ((Psr_BoxSignals_V._4_4_ & 1) != 0) {
                __assert_fail("Vec_IntSize(vSigs) % 2 == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                              ,0x52,
                              "void Psr_ManWriteVerilogArray2(FILE *, Psr_Ntk_t *, Vec_Int_t *)");
              }
              if (1 < (int)Psr_BoxSignals_V._4_4_) {
                lVar13 = 1;
                do {
                  iVar1 = *(int *)(Psr_BoxSignals_V._8_8_ + -4 + lVar13 * 4);
                  iVar2 = *(int *)(Psr_BoxSignals_V._8_8_ + lVar13 * 4);
                  fputc(0x2e,__stream);
                  pcVar8 = Abc_NamStr(p->pStrs,iVar1);
                  fputs(pcVar8,__stream);
                  fputc(0x28,__stream);
                  Psr_ManWriteVerilogSignal((FILE *)__stream,p,iVar2);
                  pcVar8 = "    \"%s\", ";
                  if (lVar13 - 1U == (ulong)(Psr_BoxSignals_V._4_4_ - 2)) {
                    pcVar8 = "T = %d\t\t";
                  }
                  fprintf(__stream,")%s",pcVar8 + 8);
                  lVar13 = lVar13 + 2;
                } while ((int)lVar13 < (int)Psr_BoxSignals_V._4_4_);
              }
            }
            fwrite(");\n",3,1,__stream);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < (p->vObjs).nSize);
      }
      fwrite("endmodule\n\n",0xb,1,__stream);
      lVar10 = lVar10 + 1;
    } while (lVar10 < vPrs->nSize);
  }
  fclose(__stream);
  return;
}

Assistant:

void Psr_ManWriteVerilog( char * pFileName, Vec_Ptr_t * vPrs )
{
    Psr_Ntk_t * pNtk = Psr_ManRoot(vPrs); int i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "// Design \"%s\" written by ABC on %s\n\n", Psr_NtkStr(pNtk, pNtk->iModuleName), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Psr_Ntk_t *, vPrs, pNtk, i )
        Psr_ManWriteVerilogNtk( pFile, pNtk );
    fclose( pFile );
}